

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O3

void __thiscall HighFreqPub::~HighFreqPub(HighFreqPub *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  if (this->hfPub != (zsock_t *)0x0) {
    zsock_destroy_checked
              (&this->hfPub,
               "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/highfreqclasses.cpp"
               ,0x13);
    this->hfPub = (zsock_t *)0x0;
  }
  pcVar1 = (this->sockEndpoint)._M_dataplus._M_p;
  paVar2 = &(this->sockEndpoint).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

HighFreqPub::~HighFreqPub() {
    if (hfPub != NULL) {
        zsock_destroy(&hfPub);
        hfPub = NULL;
    }
}